

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS ref_fixture_twod_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  REF_INT edg [3];
  REF_INT cell;
  REF_INT tri [4];
  REF_INT node;
  int local_88;
  int local_84;
  undefined4 local_80;
  REF_INT local_7c;
  ulong local_78;
  REF_GRID_conflict local_70;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  ulong local_58;
  double local_50;
  REF_DBL local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar11 = (ulong)(uint)dim;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      iVar4 = dim + -1;
      local_78 = uVar11;
      local_70 = pRVar1;
      if (0 < dim) {
        local_50 = 1.0 / (double)iVar4;
        lVar13 = 0;
        uVar6 = 0;
        do {
          local_48 = (double)(int)uVar6 * local_50 + 0.0;
          uVar14 = 0;
          local_58 = uVar6;
          do {
            uVar3 = ref_node_add(ref_node,lVar13 + uVar14,&local_34);
            if (uVar3 != 0) {
              uVar11 = (ulong)uVar3;
              pcVar12 = "node";
              uVar8 = 0x74f;
              goto LAB_001376ce;
            }
            pRVar2 = ref_node->real;
            lVar7 = (long)local_34;
            pRVar2[lVar7 * 0xf] = (double)(int)uVar14 * local_50 + 0.0;
            pRVar2[lVar7 * 0xf + 1] = local_48;
            pRVar2[lVar7 * 0xf + 2] = 0.0;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
          uVar6 = local_58 + 1;
          lVar13 = lVar13 + uVar11;
        } while (uVar6 != uVar11);
      }
      local_80 = 1;
      iVar9 = 0;
      if (0 < iVar4) {
        iVar9 = iVar4;
      }
      iVar10 = 0;
      do {
        if (iVar9 == iVar10) {
          local_80 = 2;
          iVar9 = iVar9 + 1;
          iVar10 = (int)local_78 * 2 + -1;
          iVar15 = iVar4;
          goto LAB_001378d2;
        }
        local_88 = iVar10;
        local_84 = iVar10 + 1;
        uVar3 = ref_cell_add(local_70->cell[0],&local_88,&local_7c);
        iVar10 = iVar10 + 1;
      } while (uVar3 == 0);
      uVar11 = (ulong)uVar3;
      pcVar12 = "qua";
      uVar8 = 0x75b;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      uVar11 = (ulong)uVar3;
      pcVar12 = "init glob";
      uVar8 = 0x73d;
    }
  }
  else {
    uVar11 = (ulong)uVar3;
    pcVar12 = "create";
    uVar8 = 0x736;
  }
  goto LAB_001376ce;
  while( true ) {
    local_88 = iVar15;
    local_84 = iVar10;
    uVar3 = ref_cell_add(local_70->cell[0],&local_88,&local_7c);
    iVar10 = iVar10 + iVar5;
    iVar15 = iVar15 + iVar5;
    if (uVar3 != 0) break;
LAB_001378d2:
    iVar9 = iVar9 + -1;
    iVar5 = (int)local_78;
    if (iVar9 == 0) {
      local_80 = 3;
      if (iVar5 < 2) goto LAB_00137acd;
      iVar15 = iVar5 + -2;
      iVar10 = iVar5 * iVar5 + -2;
      iVar9 = iVar4;
      goto LAB_00137959;
    }
  }
  uVar11 = (ulong)uVar3;
  pcVar12 = "edg";
  uVar8 = 0x763;
  goto LAB_001376ce;
  while( true ) {
    iVar9 = iVar9 + -1;
    iVar10 = iVar10 + -1;
    if (iVar9 < 1) break;
LAB_00137959:
    local_88 = iVar10 + 1;
    local_84 = iVar10;
    uVar3 = ref_cell_add(local_70->cell[0],&local_88,&local_7c);
    if (uVar3 != 0) {
      uVar11 = (ulong)uVar3;
      pcVar12 = "edg";
      uVar8 = 0x76b;
      goto LAB_001376ce;
    }
  }
  local_80 = 4;
  iVar5 = (int)local_78;
  if (iVar5 < 2) {
LAB_00137acd:
    local_80 = 4;
    local_5c = 1;
  }
  else {
    iVar15 = iVar15 * iVar5;
    iVar10 = iVar5 * iVar4;
    iVar9 = iVar4;
    do {
      local_88 = iVar10;
      local_84 = iVar15;
      uVar3 = ref_cell_add(local_70->cell[0],&local_88,&local_7c);
      pRVar1 = local_70;
      if (uVar3 != 0) {
        uVar11 = (ulong)uVar3;
        pcVar12 = "edg";
        uVar8 = 0x773;
        goto LAB_001376ce;
      }
      iVar9 = iVar9 + -1;
      iVar5 = (int)local_78;
      iVar15 = iVar15 - iVar5;
      iVar10 = iVar10 - iVar5;
    } while (0 < iVar9);
    local_5c = 1;
    if (1 < iVar5) {
      local_58 = (ulong)(iVar5 + 1);
      iVar9 = 0;
      local_3c = 0;
      do {
        local_3c = local_3c + 1;
        iVar10 = iVar4;
        local_38 = iVar9;
        while( true ) {
          if (iVar10 == 0) break;
          local_48 = (REF_DBL)CONCAT44(local_48._4_4_,iVar10 + -1);
          local_64 = iVar9 + 1;
          local_50 = (double)CONCAT44(local_50._4_4_,local_64);
          iVar10 = (int)local_58 + iVar9;
          local_68 = iVar9;
          local_60 = iVar10;
          uVar3 = ref_cell_add(pRVar1->cell[3],&local_68,&local_7c);
          if (uVar3 != 0) {
            uVar11 = (ulong)uVar3;
            pcVar12 = "tri";
            uVar8 = 0x77d;
            goto LAB_001376ce;
          }
          local_60 = iVar9 + (int)local_78;
          local_68 = iVar9;
          local_64 = iVar10;
          uVar3 = ref_cell_add(pRVar1->cell[3],&local_68,&local_7c);
          uVar11 = (ulong)uVar3;
          iVar10 = local_48._0_4_;
          iVar9 = local_50._0_4_;
          if (uVar3 != 0) {
            pcVar12 = "tri";
            uVar8 = 0x781;
            goto LAB_001376ce;
          }
        }
        iVar5 = (int)local_78;
        iVar9 = local_38 + iVar5;
      } while (local_3c != iVar4);
    }
  }
  uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(iVar5 * iVar5));
  if (uVar3 == 0) {
    return 0;
  }
  uVar11 = (ulong)uVar3;
  pcVar12 = "init glob";
  uVar8 = 0x785;
LAB_001376ce:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar8,
         "ref_fixture_twod_brick_grid",uVar11,pcVar12);
  return (REF_STATUS)uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_twod_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], tri[4];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  tri[3] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j, m, n);
      tri[2] = ij2node(i + 1, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = ij2node(i, j, m, n);
      tri[1] = ij2node(i + 1, j + 1, m, n);
      tri[2] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}